

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.c
# Opt level: O1

int main(int argc,char **argv)

{
  cfx_json_t *root;
  cfx_json_t *node;
  cfx_json_t *node_00;
  cfx_json_t *node_01;
  cfx_json_t *node_02;
  cfx_json_t *root_00;
  cf_char_t buf [1024];
  cf_char_t acStack_438 [1032];
  
  root = cfx_json_new();
  node = cfx_json_new_int(0x7b);
  node_00 = cfx_json_new_double(555.5);
  node_01 = cfx_json_new_string("abc");
  node_02 = cfx_json_new_string("efg");
  root_00 = cfx_json_new_array();
  cfx_json_object_add(root,"i1",node);
  cfx_json_object_add(root,"d1",node_00);
  cfx_json_array_add(root_00,node_01);
  cfx_json_array_add(root_00,node_02);
  cfx_json_object_add(root,"a1",root_00);
  cfx_json_dump_s(root,acStack_438,0x400);
  printf("json: %s\n",acStack_438);
  cfx_json_delete(root);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    cfx_json_t* json = cfx_json_new();
    cfx_json_t* i1 = cfx_json_new_int(123);
    cfx_json_t* d1 = cfx_json_new_double(555.5);
    cfx_json_t* s1 = cfx_json_new_string("abc");
    cfx_json_t* s2 = cfx_json_new_string("efg");
    cfx_json_t* a1 = cfx_json_new_array();
    cfx_json_object_add(json, "i1", i1);
    cfx_json_object_add(json, "d1", d1);
    cfx_json_array_add(a1, s1);
    cfx_json_array_add(a1, s2);
    cfx_json_object_add(json, "a1", a1);
    cf_char_t buf[1024];
    cfx_json_dump_s(json, buf, 1024);
    printf("json: %s\n", buf);
    // cfx_json_load_s(buf);

    cfx_json_delete(json);
    return 0;
}